

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall
edition_unittest::TestExtensionRangeSerialize::~TestExtensionRangeSerialize
          (TestExtensionRangeSerialize *this)

{
  ~TestExtensionRangeSerialize(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TestExtensionRangeSerialize::~TestExtensionRangeSerialize() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestExtensionRangeSerialize)
  SharedDtor(*this);
}